

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# em.cpp
# Opt level: O1

void __thiscall merlin::em::m_step(em *this)

{
  double dVar1;
  em *peVar2;
  _func_int **pp_Var3;
  size_t sVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  pointer pfVar9;
  factor *f;
  vector<merlin::factor,_std::allocator<merlin::factor>_> new_thetas;
  config_index cv2;
  index_config cv1;
  variable_set scope;
  factor new_th;
  variable_set vx;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  config;
  factor temp;
  factor sum;
  vector<merlin::factor,_std::allocator<merlin::factor>_> local_3c8;
  em *local_3b0;
  ulong local_3a8;
  vector<merlin::factor,_std::allocator<merlin::factor>_> local_3a0;
  config_index local_388;
  index_config local_350;
  variable_set local_318;
  factor local_2e0;
  variable_set local_280;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  local_248;
  factor local_218;
  undefined1 local_1b8 [64];
  pointer local_178;
  pointer local_170;
  
  if (this->m_debug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[DEBUG] Begin M-step",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
            (&local_3c8,
             ((long)(this->m_gmo).m_factors.
                    super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_gmo).m_factors.
                    super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5) * -0x5555555555555555,
             (allocator_type *)local_1b8);
  pfVar9 = (this->m_gmo).m_factors.
           super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_gmo).m_factors.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
      _M_impl.super__Vector_impl_data._M_finish != pfVar9) {
    uVar7 = 0;
    local_3b0 = this;
    do {
      peVar2 = local_3b0;
      pp_Var3 = (_func_int **)(long)pfVar9[uVar7].c_;
      local_3a8 = uVar7;
      if ((long)pp_Var3 < 0) {
LAB_00142074:
        __assert_fail("x >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/src/em.cpp"
                      ,0x8f,"void merlin::em::m_step()");
      }
      dVar1 = (local_3b0->m_gmo).m_dims.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[(long)pp_Var3];
      uVar6 = (ulong)dVar1;
      local_1b8._8_8_ = (long)(dVar1 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
      local_1b8._0_8_ = pp_Var3;
      variable_set::variable_set(&local_280,(variable *)local_1b8);
      factor::sum((factor *)local_1b8,
                  (peVar2->m_counts).
                  super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar7,&local_280);
      factor::binaryOp<merlin::factor::binOpDivide>
                (&local_218,
                 (peVar2->m_counts).
                 super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar7,(factor *)local_1b8);
      f = pfVar9 + uVar7;
      variable_set::variable_set(&local_318,&f->v_);
      factor::factor(&local_2e0,f);
      index_config::index_config(&local_350,&local_318,true);
      config_index::config_index(&local_388,(variable_set *)(local_1b8 + 8),true);
      if ((f->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (f->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar6 = 0;
        do {
          index_config::convert
                    ((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      *)&local_248,&local_350,uVar6);
          sVar4 = config_index::convert
                            (&local_388,
                             (map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                              *)&local_248);
          if ((ulong)((long)local_170 - (long)local_178 >> 3) <= sVar4) {
LAB_00142063:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       sVar4);
            goto LAB_00142074;
          }
          if ((local_178[sVar4] != 0.0) || (NAN(local_178[sVar4]))) {
            if (uVar6 < (ulong)((long)local_218.t_.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)local_218.t_.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start >> 3)) {
              if (uVar6 < (ulong)((long)local_2e0.t_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)local_2e0.t_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 3)) {
                local_2e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6] =
                     local_218.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar6];
                goto LAB_00141dc5;
              }
            }
            sVar4 = std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar6);
            goto LAB_00142063;
          }
LAB_00141dc5:
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::~_Rb_tree(&local_248);
          uVar6 = uVar6 + 1;
        } while (uVar6 < (ulong)((long)(f->t_).super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(f->t_).super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 3));
      }
      factor::operator=(local_3c8.
                        super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar7,&local_2e0);
      this = local_3b0;
      if (local_388.m_vars.super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_388.m_vars.
                        super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_388.m_dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_388.m_dims.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_350.m_vars.super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_350.m_vars.
                        super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_350.m_dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_350.m_dims.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      factor::~factor(&local_2e0);
      variable_set::~variable_set(&local_318);
      factor::~factor(&local_218);
      factor::~factor((factor *)local_1b8);
      variable_set::~variable_set(&local_280);
      uVar7 = local_3a8 + 1;
      pfVar9 = (this->m_gmo).m_factors.
               super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)(((long)(this->m_gmo).m_factors.
                                    super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar9 >> 5)
                            * -0x5555555555555555));
  }
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector(&local_3a0,&local_3c8);
  graphical_model::graphical_model((graphical_model *)local_1b8,&local_3a0);
  graphical_model::operator=(&this->m_gmo,(graphical_model *)local_1b8);
  graphical_model::~graphical_model((graphical_model *)local_1b8);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&local_3a0);
  cte::reinit(&this->m_infer,&(this->m_gmo).m_factors);
  if (this->m_debug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[DEBUG] End M-step",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[DEBUG] Updated parameters:",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    if (local_3c8.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_3c8.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar8 = 0;
      uVar7 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[DEBUG]  ",9);
        poVar5 = operator<<((ostream *)&std::cout,
                            (factor *)
                            ((long)&(local_3c8.
                                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_vptr_factor +
                            lVar8));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x60;
      } while (uVar7 < (ulong)(((long)local_3c8.
                                      super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_3c8.
                                      super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5) *
                              -0x5555555555555555));
    }
  }
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&local_3c8);
  return;
}

Assistant:

void em::m_step() {

	if (m_debug) {
		std::cout << "[DEBUG] Begin M-step" << std::endl;
	}

	// Update the new parameters by dividing the corresponding counts
	const std::vector<factor>& thetas = m_gmo.get_factors();
	std::vector<factor> new_thetas(thetas.size());

	// counts factors must be aligned to the theta factors (by construction)
	for (size_t i = 0; i < thetas.size(); ++i) {
		const factor& th = thetas[i];
		int x = th.get_child();
		assert(x >= 0);

		variable_set vx(m_gmo.var(x));
		factor sum = m_counts[i].sum(vx);
		factor temp = m_counts[i] / sum;
		variable_set scope = th.vars();
		factor new_th = th; // copy the previous factor
		index_config cv1(scope, true);
		config_index cv2(sum.vars(), true);
		for (size_t j = 0; j < th.num_states(); ++j) {
			std::map<size_t, size_t> config = cv1.convert(j);
			size_t k = cv2.convert(config);
			if (sum.get(k) != 0) {
				double v = temp.get(j);
				new_th.set(j, v);
			}
		}

		new_thetas[i] = new_th;
	}

	// Set the new parameters (discard the old ones)
	m_gmo = graphical_model(new_thetas);
	m_infer.reinit(m_gmo.get_factors());
//	m_infer = cte(m_gmo);
//	m_infer.set_properties(m_properties);
//	m_infer.init(); // re-initialize the join tree

	if (m_debug) {
		std::cout << "[DEBUG] End M-step" << std::endl;
		std::cout << "[DEBUG] Updated parameters:" << std::endl;
		for (size_t i = 0; i < new_thetas.size(); ++i) {
			std::cout << "[DEBUG]  " << new_thetas[i] << std::endl;
		}
	}
}